

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
::construct<unsigned_int,float,float>
          (ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
           *this,uint *args,float *args_1,float *args_2)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  undefined1 auVar5 [16];
  pointer pNVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = *(ulong *)(this + 8);
  if (*(ulong *)(this + 0x10) <= uVar7) {
    pNVar6 = std::allocator_traits<std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>::
             allocate((allocator_type *)(this + 0x30),*(ulong *)(this + 0x10));
    *(pointer *)this = pNVar6;
    std::
    vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
    ::emplace_back<mapbox::detail::Earcut<unsigned_int>::Node*&>
              ((vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
                *)(this + 0x18),(Node **)this);
    uVar7 = 0;
  }
  lVar4 = *(long *)this;
  *(ulong *)(this + 8) = uVar7 + 1;
  lVar8 = uVar7 * 0x48;
  fVar2 = *args_1;
  fVar3 = *args_2;
  *(uint *)(lVar4 + lVar8) = *args;
  auVar5._8_4_ = SUB84((double)fVar3,0);
  auVar5._0_8_ = (double)fVar2;
  auVar5._12_4_ = (int)((ulong)(double)fVar3 >> 0x20);
  *(undefined1 (*) [16])(lVar4 + 8 + lVar8) = auVar5;
  *(undefined4 *)(lVar4 + 0x28 + lVar8) = 0;
  puVar1 = (undefined8 *)(lVar4 + 0x18 + lVar8);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)(lVar4 + 0x30 + lVar8);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(lVar4 + 0x40 + lVar8) = 0;
  return (Node *)(lVar4 + lVar8);
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc_traits::allocate(alloc, blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc_traits::construct(alloc, object, std::forward<Args>(args)...);
            return object;
        }